

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryTableExpr
          (BinaryReaderInterp *this,Type sig_type,CatchClauseVector *catches)

{
  Index IVar1;
  CatchClauseVector *this_00;
  bool bVar2;
  bool bVar3;
  Result result;
  Offset fixup_offset;
  size_type sVar4;
  size_t sVar5;
  TypeVector *this_01;
  Location local_2e8;
  Enum local_2c8;
  Enum local_2c4;
  Index local_2c0;
  Index local_2bc;
  Index catch_drop_count;
  Index drop_count;
  Index keep_count;
  Label *vlabel;
  bool local_2a0;
  int local_29c;
  Location local_298;
  Enum local_274;
  Location local_270;
  Var local_250;
  Location local_208;
  Var local_1e8;
  Location local_1a0;
  undefined1 local_180 [8];
  TableCatch catch_;
  CatchClause *raw_catch;
  const_iterator __end2;
  const_iterator __begin2;
  CatchClauseVector *__range2;
  undefined1 auStack_a0 [3];
  bool has_catch_all;
  Offset offset;
  HandlerDesc desc;
  u32 value_stack_height;
  Type TStack_58;
  u32 exn_stack_height;
  Location local_50;
  Enum local_2c;
  CatchClauseVector *local_28;
  CatchClauseVector *catches_local;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  local_28 = catches;
  catches_local = (CatchClauseVector *)this;
  unique0x100006f8 = sig_type;
  GetLocation(&local_50,this);
  TStack_58 = stack0xffffffffffffffec;
  local_2c = (Enum)SharedValidator::BeginTryTable
                             (&this->validator_,&local_50,stack0xffffffffffffffec);
  bVar2 = Failed((Result)local_2c);
  if (bVar2) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    sVar4 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    result = SharedValidator::GetCatchCount(&this->validator_,(int)sVar4 - 1,&value_stack_height);
    bVar2 = Failed(result);
    if (bVar2) {
      Result::Result((Result *)&sig_type_local,Error);
    }
    else {
      sVar5 = SharedValidator::type_stack_size(&this->validator_);
      desc._52_4_ = (int)sVar5 + this->local_count_;
      _auStack_a0 = Catch;
      offset = 0xffffffff;
      desc.kind = ~Catch;
      memset(&desc.try_end_offset,0,0x18);
      std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::vector
                ((vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *)
                 &desc.try_end_offset);
      desc.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
      desc.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = desc.catch_all_ref;
      desc.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = desc._53_3_;
      desc.field_4.catch_all_offset = value_stack_height;
      desc.values._0_1_ = 0;
      Istream::Emit(this->istream_,Br);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      this_00 = local_28;
      bVar2 = false;
      __end2 = std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::begin(local_28);
      raw_catch = (CatchClause *)
                  std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
                                         *)&raw_catch), bVar3) {
        catch_._176_8_ =
             __gnu_cxx::
             __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
             ::operator*(&__end2);
        Location::Location(&local_1a0);
        TableCatch::TableCatch((TableCatch *)local_180,&local_1a0);
        catch_.target.field_2._24_4_ = *(undefined4 *)catch_._176_8_;
        IVar1 = *(Index *)(catch_._176_8_ + 4);
        GetLocation(&local_208,this);
        Var::Var(&local_1e8,IVar1,&local_208);
        Var::operator=((Var *)((long)&catch_.loc.field_1 + 8),&local_1e8);
        Var::~Var(&local_1e8);
        IVar1 = *(Index *)(catch_._176_8_ + 8);
        GetLocation(&local_270,this);
        Var::Var(&local_250,IVar1,&local_270);
        Var::operator=((Var *)((long)&catch_.tag.field_2 + 0x18),&local_250);
        Var::~Var(&local_250);
        GetLocation(&local_298,this);
        local_274 = (Enum)SharedValidator::OnTryTableCatch
                                    (&this->validator_,&local_298,(TableCatch *)local_180);
        bVar3 = Failed((Result)local_274);
        if (bVar3) {
          Result::Result((Result *)&sig_type_local,Error);
          local_29c = 1;
        }
        else if (bVar2) {
          local_29c = 7;
        }
        else {
          bVar3 = TableCatch::IsCatchAll((TableCatch *)local_180);
          if (bVar3) {
            bVar2 = true;
            desc.values._0_1_ = TableCatch::IsRef((TableCatch *)local_180);
            desc.catches.
            super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = Istream::end(this->istream_);
          }
          else {
            vlabel._0_4_ = *(undefined4 *)(catch_._176_8_ + 4);
            vlabel._4_4_ = Istream::end(this->istream_);
            local_2a0 = TableCatch::IsRef((TableCatch *)local_180);
            std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
            push_back((vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *)
                      &desc.try_end_offset,(value_type *)&vlabel);
          }
          drop_count = (Index)SharedValidator::GetLabel
                                        (&this->validator_,*(Index *)(catch_._176_8_ + 8),
                                         (Label **)&keep_count);
          bVar3 = Failed((Result)drop_count);
          if (bVar3) {
            Result::Result((Result *)&sig_type_local,Error);
            local_29c = 1;
          }
          else {
            this_01 = TypeChecker::Label::br_types(_keep_count);
            sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(this_01);
            catch_drop_count = (Index)sVar4;
            sVar5 = SharedValidator::type_stack_size(&this->validator_);
            local_2bc = (int)sVar5 - (int)_keep_count->type_stack_limit;
            local_2c4 = (Enum)SharedValidator::GetCatchCount
                                        (&this->validator_,*(Index *)(catch_._176_8_ + 8),&local_2c0
                                        );
            bVar3 = Failed((Result)local_2c4);
            if (bVar3) {
              Result::Result((Result *)&sig_type_local,Error);
              local_29c = 1;
            }
            else {
              local_2c0 = local_2c0 + 1;
              EmitBr(this,*(Index *)(catch_._176_8_ + 8),local_2bc,catch_drop_count,local_2c0);
              local_29c = 0;
            }
          }
        }
        TableCatch::~TableCatch((TableCatch *)local_180);
        if ((local_29c != 0) && (local_29c != 7)) goto LAB_002398cf;
        __gnu_cxx::
        __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
        ::operator++(&__end2);
      }
      GetLocation(&local_2e8,this);
      local_2c8 = (Enum)SharedValidator::EndTryTable
                                  (&this->validator_,&local_2e8,stack0xffffffffffffffec);
      bVar2 = Failed((Result)local_2c8);
      if (bVar2) {
        Result::Result((Result *)&sig_type_local,Error);
        local_29c = 1;
      }
      else {
        offset = Istream::end(this->istream_);
        sVar4 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
                size(&this->func_->handlers);
        PushLabel(this,Try,0xffffffff,0xffffffff,(u32)sVar4);
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
        push_back(&this->func_->handlers,(value_type *)auStack_a0);
        Istream::ResolveFixupU32(this->istream_,fixup_offset);
        Result::Result((Result *)&sig_type_local,Ok);
        local_29c = 1;
      }
LAB_002398cf:
      HandlerDesc::~HandlerDesc((HandlerDesc *)auStack_a0);
    }
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnTryTableExpr(Type sig_type,
                                          const CatchClauseVector& catches) {
  // we can just emit the catch handlers beforehand, so long as we skip over
  // them when entering the try.
  CHECK_RESULT(validator_.BeginTryTable(GetLocation(), sig_type));

  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  // NOTE: *NOT* GetLocalCount. we don't count the parameters, as they're not
  // part of the frame.
  u32 value_stack_height = validator_.type_stack_size() + local_count_;

  HandlerDesc desc =
      HandlerDesc{HandlerKind::Catch,        Istream::kInvalidOffset,
                  Istream::kInvalidOffset,   {},
                  {Istream::kInvalidOffset}, value_stack_height,
                  exn_stack_height};

  istream_.Emit(Opcode::Br);
  auto offset = istream_.EmitFixupU32();

  bool has_catch_all = false;
  for (const auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    CHECK_RESULT(validator_.OnTryTableCatch(GetLocation(), catch_));
    // stop emitting handlers after catch_all - but we must still validate the
    // handlers we don't emit
    if (has_catch_all) {
      continue;
    }
    if (catch_.IsCatchAll()) {
      has_catch_all = true;
      desc.catch_all_ref = catch_.IsRef();
      desc.catch_all_offset = istream_.end();
    } else {
      desc.catches.push_back(
          CatchDesc{raw_catch.tag, istream_.end(), catch_.IsRef()});
    }
    // we can't use GetBrDropKeepCount because we're not in a real block.
    SharedValidator::Label* vlabel;
    CHECK_RESULT(validator_.GetLabel(raw_catch.depth, &vlabel));
    // we keep the exception's results.
    // (this has already been validated, above)
    Index keep_count = vlabel->br_types().size();
    // we drop everything between the current block and the br target.
    // (we have already taken the TryTable block parameters into account, in
    // BeginTryTable)
    Index drop_count = validator_.type_stack_size() - vlabel->type_stack_limit;
    Index catch_drop_count;
    // we use the regular catch count
    CHECK_RESULT(validator_.GetCatchCount(raw_catch.depth, &catch_drop_count));
    // but increment, as we are semantically in a catch
    catch_drop_count++;
    EmitBr(raw_catch.depth, drop_count, keep_count, catch_drop_count);
  }

  CHECK_RESULT(validator_.EndTryTable(GetLocation(), sig_type));

  desc.try_start_offset = istream_.end();

  // as usual, the label is pushed after the catch handlers
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(std::move(desc));

  istream_.ResolveFixupU32(offset);

  return Result::Ok;
}